

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O2

void __thiscall mocker::ast::StringLitExpr::~StringLitExpr(StringLitExpr *this)

{
  ~StringLitExpr(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

explicit StringLitExpr(std::string val) : val(std::move(val)) {}